

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               BufferMode bufferMode,deUint32 features,int numCases,deUint32 baseSeed)

{
  int iVar1;
  TestNode *node;
  SSBOLayoutCase *this;
  int iVar2;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  iVar1 = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  if (0 < numCases) {
    iVar2 = 0;
    do {
      this = (SSBOLayoutCase *)operator_new(0xe0);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      SSBOLayoutCase::SSBOLayoutCase
                (this,context->m_testCtx,context->m_renderCtx,(char *)local_1c8,
                 glcts::fixed_sample_locations_values + 1,GLSL_VERSION_310_ES,bufferMode);
      (this->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SSBOLayoutCase_021aa628;
      *(deUint32 *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = features;
      *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 4;
      *(uint *)&this[1].super_TestCase.super_TestNode.m_testCtx =
           (int)(features << 0x1a) >> 0x1f & 3;
      *(deUint32 *)((long)&this[1].super_TestCase.super_TestNode.m_testCtx + 4) = features * 2 & 8;
      *(deUint32 *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           features >> 2 & 2;
      *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           0x400000005;
      *(deUint32 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
           iVar1 + baseSeed + iVar2;
      this[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)&DAT_100000001;
      *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 1;
      tcu::TestNode::addChild(node,(TestNode *)this);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      iVar2 = iVar2 + 1;
    } while (numCases != iVar2);
  }
  return;
}

Assistant:

static void createRandomCaseGroup (tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName, const char* description, SSBOLayoutCase::BufferMode bufferMode, deUint32 features, int numCases, deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomSSBOLayoutCase(context, de::toString(ndx).c_str(), "", bufferMode, features, (deUint32)ndx+baseSeed));
}